

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O0

void __thiscall amrex::BndryData::setValue(BndryData *this,Orientation face,int n,Real val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Box *pBVar8;
  long in_RDI;
  double in_XMM0_Qa;
  int i;
  int j;
  int k;
  int m;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  int ncomp;
  Box *bx;
  Array4<double> arr;
  FArrayBox *fab;
  undefined4 in_stack_fffffffffffffd80;
  int iVar9;
  undefined4 in_stack_fffffffffffffd84;
  int iVar10;
  int local_278;
  int local_274;
  Array4<double> local_228;
  BaseFab<double> *local_1e8;
  double local_1e0;
  Orientation local_1c4;
  BaseFab<double> *local_1c0;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_1e0 = in_XMM0_Qa;
  Orientation::operator_cast_to_int(&local_1c4);
  local_1e8 = &FabSet::operator[]((FabSet *)
                                  CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                                  (int)((ulong)in_RDI >> 0x20))->super_BaseFab<double>;
  local_a8 = local_1e8->dptr;
  local_b0 = &local_1e8->domain;
  local_b4 = local_1e8->nvar;
  local_5c = 0;
  local_88 = (local_b0->smallend).vect[0];
  local_6c = 1;
  iStack_84 = (local_1e8->domain).smallend.vect[1];
  local_d0.x = (local_b0->smallend).vect[0];
  local_d0.y = (local_b0->smallend).vect[1];
  local_7c = 2;
  local_d0.z = (local_1e8->domain).smallend.vect[2];
  local_8 = &(local_1e8->domain).bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(local_1e8->domain).bigend;
  local_1c = 1;
  iStack_34 = (local_1e8->domain).bigend.vect[1] + 1;
  local_28 = &(local_1e8->domain).bigend;
  local_2c = 2;
  local_f0.z = (local_1e8->domain).bigend.vect[2] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_1c0 = local_1e8;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4(&local_228,local_a8,&local_c0,&local_e0,local_b4);
  pBVar8 = BaseFab<double>::box(local_1e8);
  iVar1 = *(int *)(in_RDI + 0xc70);
  iVar2 = (pBVar8->smallend).vect[0];
  iVar3 = (pBVar8->smallend).vect[1];
  iVar4 = (pBVar8->smallend).vect[2];
  iVar5 = (pBVar8->bigend).vect[0];
  iVar6 = (pBVar8->bigend).vect[1];
  iVar7 = (pBVar8->bigend).vect[2];
  for (local_274 = 0; local_278 = iVar4, local_274 < iVar1; local_274 = local_274 + 1) {
    for (; iVar10 = iVar3, local_278 <= iVar7; local_278 = local_278 + 1) {
      for (; iVar9 = iVar2, iVar10 <= iVar6; iVar10 = iVar10 + 1) {
        for (; iVar9 <= iVar5; iVar9 = iVar9 + 1) {
          local_228.p
          [(long)(iVar9 - local_228.begin.x) + (iVar10 - local_228.begin.y) * local_228.jstride +
           (local_278 - local_228.begin.z) * local_228.kstride + local_274 * local_228.nstride] =
               local_1e0;
        }
      }
    }
  }
  return;
}

Assistant:

void
BndryData::setValue (Orientation face, int n, Real val) noexcept
{
    auto& fab = bndry[face][n];
    auto arr = fab.array();
    const Box& bx = fab.box();
    const int ncomp = m_ncomp;
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, m,
    {
        arr(i,j,k,m) = val;
    });
}